

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGet *curr)

{
  ExternalInterface *pEVar1;
  undefined8 uVar2;
  undefined1 local_a0 [8];
  TableInstanceInfo info;
  undefined1 local_70 [8];
  Flow index;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_70,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->index);
  if (index.breakTo.super_IString.str._M_len == 0) {
    getTableInstanceInfo((TableInstanceInfo *)local_a0,this,(Name)(curr->table).super_IString.str);
    if (((long)((long)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_70 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    uVar2 = wasm::Literal::getUnsigned();
    pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_a0)->externalInterface;
    (*pEVar1->_vptr_ExternalInterface[0x1d])
              (&info.name.super_IString.str._M_str,pEVar1,info.instance,
               info.name.super_IString.str._M_len,uVar2);
    Flow::Flow(__return_storage_ptr__,(Literal *)&info.name.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_70;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&index);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)index.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)index.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &index.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&index);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGet(TableGet* curr) {
    NOTE_ENTER("TableGet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    return info.interface()->tableLoad(info.name, address);
  }